

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall
burst::dynamic_tuple::dynamic_tuple<int,bool,double,void>
          (dynamic_tuple *this,int *head,bool *tail,double *tail_1)

{
  initializer_list<int> iVar1;
  int local_50 [2];
  iterator local_48;
  undefined8 local_40;
  double *local_28;
  double *tail_local_1;
  bool *tail_local;
  int *head_local;
  dynamic_tuple *this_local;
  
  this->m_capacity = 0x10;
  local_28 = tail_1;
  tail_local_1 = (double *)tail;
  tail_local = (bool *)head;
  head_local = (int *)this;
  std::make_unique<signed_char[]>((size_t)&this->m_data);
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  vector(&this->m_objects);
  this->m_volume = 0;
  push_back_no_realloc<int>(this,(int *)tail_local);
  push_back_no_realloc<bool>(this,(bool *)tail_local_1);
  local_50[0] = 0;
  push_back_no_realloc<double>(this,local_28);
  local_50[1] = 0;
  local_48 = local_50;
  local_40 = 2;
  iVar1._M_len = 2;
  iVar1._M_array = local_48;
  burst::detail::dummy(iVar1);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }